

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packetizer.cc
# Opt level: O0

ssize_t __thiscall decoder::Packetizer::read(Packetizer *this,int __fd,void *__buf,size_t __nbytes)

{
  element_type *peVar1;
  undefined4 extraout_var;
  runtime_error *this_00;
  int nbytes;
  int rv;
  int *in_stack_00000130;
  char (*in_stack_00000138) [2];
  char (*in_stack_00000140) [99];
  char (*in_stack_00000148) [36];
  string local_38 [32];
  int local_18;
  int local_14;
  Packetizer *local_10;
  undefined1 local_1;
  
  local_18 = (int)this->len_ - (int)this->pos_;
  local_10 = this;
  peVar1 = std::__shared_ptr_access<decoder::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<decoder::Reader,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1b441a);
  local_14 = (*peVar1->_vptr_Reader[2])(peVar1,this->buf_ + this->pos_,(long)local_18);
  if (local_14 == -1) {
    perror("read");
    exit(1);
  }
  if (local_14 == 0) {
    local_1 = 0;
    this = (Packetizer *)CONCAT44(extraout_var,local_14);
  }
  else {
    if (local_14 != local_18) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      util::str<char[36],char[99],char[2],int>
                (in_stack_00000148,in_stack_00000140,in_stack_00000138,in_stack_00000130);
      std::runtime_error::runtime_error(this_00,local_38);
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this->symbolPos_ = (long)local_18 + this->symbolPos_;
    local_1 = 1;
  }
  return CONCAT71((int7)((ulong)this >> 8),local_1);
}

Assistant:

bool Packetizer::read()  {
  int rv;
  int nbytes = len_ - pos_;
  rv = reader_->read(buf_ + pos_, nbytes);
  if (rv == -1) {
    perror("read");
    exit(1);
  }
  if (rv == 0) {
    return false;
  }
  ASSERT(rv == nbytes);
  symbolPos_ += nbytes;
  return true;
}